

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMElementImpl.cpp
# Opt level: O2

DOMNode * __thiscall
xercesc_4_0::DOMElementImpl::getPreviousLogicalSibling(DOMElementImpl *this,DOMNode *n)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  DOMNode *pDVar2;
  
  iVar1 = (*n->_vptr_DOMNode[9])(n);
  pDVar2 = (DOMNode *)CONCAT44(extraout_var,iVar1);
  while( true ) {
    if (pDVar2 != (DOMNode *)0x0) {
      return pDVar2;
    }
    iVar1 = (*n->_vptr_DOMNode[5])(n);
    n = (DOMNode *)CONCAT44(extraout_var_00,iVar1);
    if (n == (DOMNode *)0x0) break;
    iVar1 = (*n->_vptr_DOMNode[4])(n);
    if (iVar1 != 5) {
      return (DOMNode *)0x0;
    }
    iVar1 = (*n->_vptr_DOMNode[9])(n);
    pDVar2 = (DOMNode *)CONCAT44(extraout_var_01,iVar1);
  }
  return (DOMNode *)0x0;
}

Assistant:

DOMNode* DOMElementImpl::getPreviousLogicalSibling(const DOMNode* n) const
{
    DOMNode* prev = n->getPreviousSibling();
    // If "n" has no previous sibling and its parent is an entity reference node we
    // need to continue the search through the previous siblings of the entity
    // reference as these are logically siblings of the given node.
    if (prev == NULL) {
        DOMNode* parent = n->getParentNode();
        while (parent != NULL && parent->getNodeType() == DOMNode::ENTITY_REFERENCE_NODE) {
            prev = parent->getPreviousSibling();
            if (prev != NULL) {
                break;
            }
            parent = parent->getParentNode();
        }
    }
    return prev;
}